

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

RealType __thiscall OpenMD::RNEMD::SPFForceManager::getScaledDeltaU(SPFForceManager *this)

{
  double dVar1;
  double dVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar3 [16];
  RealType RVar4;
  shared_ptr<OpenMD::SPFData> currentSPFData;
  undefined1 local_38 [40];
  
  Snapshot::getSPFData((Snapshot *)local_38);
  dVar1 = *(RealType *)(local_38._0_8_ + 0x18);
  if ((0x7fefffffffffffff < (ulong)ABS(this->potentialSink_)) ||
     (0x7fefffffffffffff < (ulong)ABS(this->potentialSource_))) {
    snprintf(painCave.errMsg,2000,
             "SPFForceManager detected a numerical error in the potential\n\tenergy with a lambda value of %f. Selecting a new molecule.\n"
            );
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    this->hasSelectedMolecule_ = false;
    SPFData::clear((SPFData *)local_38._0_8_);
  }
  RVar4 = 0.0;
  if (1e-06 <= dVar1) {
    dVar2 = pow(dVar1,(double)this->k_);
    local_38._24_4_ = extraout_XMM0_Dc;
    local_38._16_8_ = dVar2;
    local_38._28_4_ = extraout_XMM0_Dd;
    dVar1 = pow(dVar1 - this->deltaLambda_,(double)this->k_);
    auVar3._8_4_ = SUB84(dVar1,0);
    auVar3._0_8_ = local_38._16_8_;
    auVar3._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar3 = minpd(_DAT_002497b0,auVar3);
    RVar4 = (this->potentialSink_ - this->potentialSource_) *
            -((double)(-(ulong)(0.0 <= (double)local_38._16_8_) & auVar3._0_8_) -
             (double)(-(ulong)(0.0 <= dVar1) & auVar3._8_8_));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return RVar4;
}

Assistant:

RealType SPFForceManager::getScaledDeltaU() {
    std::shared_ptr<SPFData> currentSPFData = currentSnapshot_->getSPFData();

    RealType lambda = currentSPFData->lambda;

    // Some checking against unreasonable potentials
    if (std::isinf(potentialSink_) || std::isnan(potentialSink_) ||
        std::isinf(potentialSource_) || std::isnan(potentialSource_)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SPFForceManager detected a numerical error in the potential\n"
          "\tenergy with a lambda value of %f. Selecting a new molecule.\n",
          lambda);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      hasSelectedMolecule_ = false;
      currentSPFData->clear();
    }

    if (lambda < 1e-6) { return 0.0; }

    return -(f_lambda(lambda) - f_lambda(lambda - deltaLambda_)) *
           (potentialSink_ - potentialSource_);
  }